

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSC.cpp
# Opt level: O1

void __thiscall CSC::Triplet(CSC *this)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CSC:",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  if (0 < this->col) {
    lVar3 = 0;
    do {
      iVar1 = this->ptr[lVar3];
      lVar5 = (long)iVar1;
      lVar4 = lVar3 + 1;
      if (iVar1 < this->ptr[lVar3 + 1]) {
        do {
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->idx[lVar5]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          poVar2 = std::ostream::_M_insert<double>(this->val[lVar5]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
          lVar5 = lVar5 + 1;
        } while (lVar5 < this->ptr[lVar4]);
      }
      lVar3 = lVar4;
    } while (lVar4 < this->col);
  }
  return;
}

Assistant:

void CSC::Triplet()
{
    cout<<"CSC:"<<"\n";
   for(int i=0; i<col; i++)
   {
       for(int j=ptr[i]; j<ptr[i+1]; j++)
       {
           std::cout << idx[j] << "\t"; // row
           std::cout << i << "\t";     //column
           std::cout << val[j] << "\n"; //value
       }
   }
}